

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O3

void __thiscall fasttext::FastText::getWordVector(FastText *this,Vector *vec,string *word)

{
  undefined1 auVar1 [16];
  pointer piVar2;
  vector<int,_std::allocator<int>_> *__range1;
  pointer piVar3;
  undefined1 in_ZMM0 [64];
  vector<int,_std::allocator<int>_> local_38;
  
  Dictionary::getSubwords
            (&local_38,
             (this->dict_).super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr,word);
  Vector::zero(vec);
  piVar2 = local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  piVar3 = local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
  if (local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    do {
      Vector::addRow(vec,(this->input_).
                         super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                     (long)*piVar3);
      piVar3 = piVar3 + 1;
    } while (piVar3 != piVar2);
    if ((long)local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_finish -
        (long)local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start != 0) {
      auVar1 = vcvtusi2sd_avx512f(in_ZMM0._0_16_,
                                  (long)local_38.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_38.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_start >> 2);
      Vector::mul(vec,(float)(1.0 / auVar1._0_8_));
    }
  }
  if (local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void FastText::getWordVector(Vector& vec, const std::string& word) const {
  const std::vector<int32_t>& ngrams = dict_->getSubwords(word);
  vec.zero();
  for (int32_t ngram : ngrams) {
    addInputVector(vec, ngram);
  }

  if (ngrams.size() > 0) {
    vec.mul(1.0 / ngrams.size());
  }
}